

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.h
# Opt level: O3

void __thiscall asl::TextFile::TextFile(TextFile *this,String *name,OpenMode mode)

{
  (this->super_File)._file = (FILE *)0x0;
  (this->super_File)._path._size = 0;
  (this->super_File)._path._len = 0;
  (this->super_File)._path.field_2._space[0] = '\0';
  (this->super_File)._info.size = -1;
  (this->super_File)._info.lastModified._t = 0.0;
  (this->super_File)._info.creationDate._t = 0.0;
  (this->super_File)._info.flags = 0;
  (this->super_File)._endian = ENDIAN_NATIVE;
  File::open(&this->super_File,(char *)name,mode | TEXT);
  return;
}

Assistant:

ASL_EXPLICIT TextFile(const String& name, OpenMode mode) { open(name, mode); }